

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseBuilder::addPass(BaseBuilder *this,Pass *pass)

{
  Error EVar1;
  Pass **in_RSI;
  Pass *in_RDI;
  Error _err;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI[2]._vptr_Pass == (_func_int **)0x0) {
    EVar1 = DebugUtils::errored(5);
  }
  else if (in_RSI == (Pass **)0x0) {
    EVar1 = DebugUtils::errored(1);
  }
  else if (in_RSI[1] == (Pass *)0x0) {
    EVar1 = ZoneVector<asmjit::v1_14::Pass_*>::append
                      ((ZoneVector<asmjit::v1_14::Pass_*> *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (ZoneAllocator *)in_RDI,in_RSI);
    if (EVar1 == 0) {
      in_RSI[1] = in_RDI;
      EVar1 = 0;
    }
  }
  else if (in_RSI[1] == in_RDI) {
    EVar1 = 0;
  }
  else {
    EVar1 = DebugUtils::errored(3);
  }
  return EVar1;
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseBuilder::addPass(Pass* pass) noexcept {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(pass == nullptr)) {
    // Since this is directly called by `addPassT()` we treat `null` argument
    // as out-of-memory condition. Otherwise it would be API misuse.
    return DebugUtils::errored(kErrorOutOfMemory);
  }
  else if (ASMJIT_UNLIKELY(pass->_cb)) {
    // Kinda weird, but okay...
    if (pass->_cb == this)
      return kErrorOk;
    return DebugUtils::errored(kErrorInvalidState);
  }

  ASMJIT_PROPAGATE(_passes.append(&_allocator, pass));
  pass->_cb = this;
  return kErrorOk;
}